

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

void layout_objmenu(gamewin *gw)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  wchar_t local_48;
  int local_44;
  wchar_t scrwidth;
  wchar_t scrheight;
  wchar_t itemwidth;
  wchar_t maxwidth;
  wchar_t i;
  char weightstr [16];
  win_objmenu *mdat;
  gamewin *gw_local;
  
  iVar2 = _COLS;
  iVar1 = _LINES;
  weightstr._8_8_ = gw + 1;
  *(undefined4 *)((long)&gw[2].resize + 4) = 2;
  if ((gw[1].next != (gamewin *)0x0) && (*(char *)&(gw[1].next)->draw != '\0')) {
    *(int *)((long)&gw[2].resize + 4) = *(int *)((long)&gw[2].resize + 4) + 2;
  }
  if (*(int *)&gw[1].prev < 0x34) {
    local_44 = *(int *)&gw[1].prev;
  }
  else {
    local_44 = 0x34;
  }
  *(int *)&gw[2].resize = *(int *)((long)&gw[2].resize + 4) + local_44;
  if (iVar1 < *(int *)&gw[2].resize) {
    *(int *)&gw[2].resize = iVar1;
  }
  *(int *)&gw[2].win = *(int *)&gw[2].resize - *(int *)((long)&gw[2].resize + 4);
  scrheight = L'\0';
  for (itemwidth = L'\0'; itemwidth < *(wchar_t *)(weightstr._8_8_ + 0x20);
      itemwidth = itemwidth + L'\x01') {
    sVar3 = strlen((char *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124));
    scrwidth = (wchar_t)sVar3;
    if (*(int *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124 + 0x104) == 1) {
      scrwidth = scrwidth + L'\x02';
    }
    if ((settings.invweight != '\0') &&
       (*(int *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124 + 0x118) != -1)) {
      sprintf((char *)&maxwidth," {%d}",
              (ulong)*(uint *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124 + 0x118));
      sVar3 = strlen((char *)&maxwidth);
      scrwidth = scrwidth + (int)sVar3;
    }
    if ((*(int *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124 + 0x104) == 1) &&
       (*(char *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124 + 0x120) != '\0')) {
      scrwidth = scrwidth + L'\x04';
    }
    if ((*(int *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124 + 0x104) == 2) &&
       (*(char *)(*(long *)(weightstr._8_8_ + 8) + (long)itemwidth * 0x124 + 0x121) != '\0')) {
      scrwidth = scrwidth + L'\a';
    }
    if (scrwidth < scrheight) {
      local_48 = scrheight;
    }
    else {
      local_48 = scrwidth;
    }
    scrheight = local_48;
  }
  *(wchar_t *)(weightstr._8_8_ + 0x40) = scrheight;
  if (iVar2 + -4 < *(int *)(weightstr._8_8_ + 0x40)) {
    *(int *)(weightstr._8_8_ + 0x40) = iVar2 + -4;
  }
  *(int *)(weightstr._8_8_ + 0x3c) = *(int *)(weightstr._8_8_ + 0x40) + 4;
  if (*(long *)(weightstr._8_8_ + 0x18) != 0) {
    iVar1 = *(int *)(weightstr._8_8_ + 0x3c);
    sVar3 = strlen(*(char **)(weightstr._8_8_ + 0x18));
    if ((ulong)(long)iVar1 < sVar3 + 4) {
      sVar3 = strlen(*(char **)(weightstr._8_8_ + 0x18));
      *(int *)(weightstr._8_8_ + 0x40) = (int)sVar3;
      *(int *)(weightstr._8_8_ + 0x3c) = *(int *)(weightstr._8_8_ + 0x40) + 4;
    }
  }
  return;
}

Assistant:

static void layout_objmenu(struct gamewin *gw)
{
    struct win_objmenu *mdat = (struct win_objmenu*)gw->extra;
    char weightstr[16];
    int i, maxwidth, itemwidth;
    int scrheight = LINES;
    int scrwidth = COLS;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    maxwidth = 0;
    for (i = 0; i < mdat->icount; i++) {
	itemwidth = strlen(mdat->items[i].caption);
	
	/* add extra space for an object symbol */
	if (mdat->items[i].role == MI_NORMAL)
	    itemwidth += 2;
	
	/* if the weight is known, leave space to show it */
	if (settings.invweight && mdat->items[i].weight != -1) {
	    sprintf(weightstr, " {%d}", mdat->items[i].weight);
	    itemwidth += strlen(weightstr);
	}
	if (mdat->items[i].role == MI_NORMAL && mdat->items[i].accel)
	    itemwidth += 4; /* "a - " */
	if (mdat->items[i].role == MI_HEADING && mdat->items[i].group_accel)
	    itemwidth += 7; /* "  (')')" */
	maxwidth = max(maxwidth, itemwidth);
    }
    
    mdat->innerwidth = maxwidth;
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}